

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void canvas_deletelinesfor(_glist *x,t_text *text)

{
  _outconnect *oc;
  t_linetraverser t;
  t_linetraverser local_90;
  
  local_90.tr_ob = (t_text *)0x0;
  local_90.tr_nextoc = (_outconnect *)0x0;
  local_90.tr_nout = 0;
  local_90.tr_nextoutno = 0;
  local_90.tr_x = x;
  oc = linetraverser_next(&local_90);
  if (oc != (_outconnect *)0x0) {
    do {
      if ((local_90.tr_ob == text) || (local_90.tr_ob2 == text)) {
        _canvas_delete_line(x,oc);
        obj_disconnect(local_90.tr_ob,local_90.tr_outno,local_90.tr_ob2,local_90.tr_inno);
      }
      oc = linetraverser_next(&local_90);
    } while (oc != (_outconnect *)0x0);
  }
  return;
}

Assistant:

void canvas_deletelinesfor(t_canvas *x, t_text *text)
{
    t_linetraverser t;
    t_outconnect *oc;
    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
    {
        if (t.tr_ob == text || t.tr_ob2 == text)
        {
            _canvas_delete_line(x, oc);
            obj_disconnect(t.tr_ob, t.tr_outno, t.tr_ob2, t.tr_inno);
        }
    }
}